

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbRead(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  size_t sVar2;
  int iVar3;
  sqlite3_mutex *psVar4;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
  }
  sVar2 = (size_t)iAmt;
  if (*(long *)psVar1 < (long)(sVar2 + iOfst)) {
    memset(zBuf,0,sVar2);
    sVar2 = *(long *)psVar1 - iOfst;
    if (sVar2 != 0 && iOfst <= *(long *)psVar1) {
      memcpy(zBuf,psVar1->xWrite + iOfst,sVar2);
    }
    psVar4 = (sqlite3_mutex *)psVar1->xTruncate;
    iVar3 = 0x20a;
  }
  else {
    memcpy(zBuf,psVar1->xWrite + iOfst,sVar2);
    psVar4 = (sqlite3_mutex *)psVar1->xTruncate;
    iVar3 = 0;
  }
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return iVar3;
}

Assistant:

static int memdbRead(
  sqlite3_file *pFile,
  void *zBuf,
  int iAmt,
  sqlite_int64 iOfst
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( iOfst+iAmt>p->sz ){
    memset(zBuf, 0, iAmt);
    if( iOfst<p->sz ) memcpy(zBuf, p->aData+iOfst, p->sz - iOfst);
    memdbLeave(p);
    return SQLITE_IOERR_SHORT_READ;
  }
  memcpy(zBuf, p->aData+iOfst, iAmt);
  memdbLeave(p);
  return SQLITE_OK;
}